

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

bool __thiscall
slang::ast::DiagnosticVisitor::handleDefault<slang::ast::WaitStatement>
          (DiagnosticVisitor *this,WaitStatement *symbol)

{
  WaitStatement *symbol_local;
  DiagnosticVisitor *this_local;
  
  if (((ulong)this->errorLimit < *this->numErrors) || ((this->hierarchyProblem & 1U) != 0)) {
    this_local._7_1_ = false;
  }
  else {
    ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false>::visitDefault<slang::ast::WaitStatement>
              ((ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false> *)this,symbol);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool handleDefault(const T& symbol) {
        if (numErrors > errorLimit || hierarchyProblem)
            return false;

        if constexpr (std::is_base_of_v<Symbol, T>) {
            auto declaredType = symbol.getDeclaredType();
            if (declaredType) {
                declaredType->getType();
                declaredType->getInitializer();
            }

            if constexpr (std::is_same_v<ParameterSymbol, T> ||
                          std::is_same_v<EnumValueSymbol, T> ||
                          std::is_same_v<SpecparamSymbol, T>) {
                symbol.getValue();
            }

            for (auto attr : compilation.getAttributes(symbol))
                attr->getValue();
        }

        if constexpr (is_detected_v<getBody_t, T>) {
            auto& body = symbol.getBody();
            if (body.bad())
                return true;

            body.visit(*this);
        }

        visitDefault(symbol);
        return true;
    }